

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall DACSThinker::DumpScriptStatus(DACSThinker *this)

{
  DLevelScript *pDVar1;
  char *in_RAX;
  DLevelScript **ppDVar2;
  FString local_28;
  
  ppDVar2 = &this->Scripts;
  local_28.Chars = in_RAX;
  while (pDVar1 = *ppDVar2, pDVar1 != (DLevelScript *)0x0) {
    ScriptPresentation((int)&local_28);
    Printf("%s: %s\n",local_28.Chars,
           _ZZN11DACSThinker16DumpScriptStatusEvE10stateNames_rel +
           *(int *)(_ZZN11DACSThinker16DumpScriptStatusEvE10stateNames_rel +
                   (ulong)pDVar1->state * 4));
    FString::~FString(&local_28);
    ppDVar2 = &pDVar1->next;
  }
  return;
}

Assistant:

void DACSThinker::DumpScriptStatus ()
{
	static const char *stateNames[] =
	{
		"Running",
		"Suspended",
		"Delayed",
		"TagWait",
		"PolyWait",
		"ScriptWaitPre",
		"ScriptWait",
		"PleaseRemove"
	};
	DLevelScript *script = Scripts;

	while (script != NULL)
	{
		Printf("%s: %s\n", ScriptPresentation(script->script).GetChars(), stateNames[script->state]);
		script = script->next;
	}
}